

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool __thiscall ON_RTree::Remove(ON_RTree *this,double *a_min,double *a_max,int a_dataId)

{
  bool bVar1;
  undefined1 local_58 [8];
  ON_RTreeBBox rect;
  bool rc;
  int a_dataId_local;
  double *a_max_local;
  double *a_min_local;
  ON_RTree *this_local;
  
  rect.m_max[2]._3_1_ = 0;
  if (this->m_root != (ON_RTreeNode *)0x0) {
    local_58 = (undefined1  [8])*a_min;
    rect.m_min[0] = a_min[1];
    rect.m_min[1] = a_min[2];
    rect.m_min[2] = *a_max;
    rect.m_max[0] = a_max[1];
    rect.m_max[1] = a_max[2];
    rect.m_max[2]._4_4_ = a_dataId;
    if (((rect.m_min[2] < (double)local_58) || (rect.m_max[0] < rect.m_min[0])) ||
       (rect.m_max[1] < rect.m_min[1])) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_rtree.cpp"
                 ,0x3f9,"","ON_RTree::Remove - invalid a_min[] or a_max[] input.");
    }
    else {
      bVar1 = RemoveRect(this,(ON_RTreeBBox *)local_58,(long)a_dataId,&this->m_root);
      rect.m_max[2]._3_1_ = !bVar1;
    }
  }
  return (bool)(rect.m_max[2]._3_1_ & 1);
}

Assistant:

bool ON_RTree::Remove(const double a_min[ON_RTree_NODE_DIM], const double a_max[ON_RTree_NODE_DIM], int a_dataId)
{
  bool rc = false;
  if ( 0 != m_root )
  {
    ON_RTreeBBox rect;
    memcpy(rect.m_min,a_min,sizeof(rect.m_min));
    memcpy(rect.m_max,a_max,sizeof(rect.m_max));
    if ( rect.m_min[0] <= rect.m_max[0] && rect.m_min[1] <= rect.m_max[1] && rect.m_min[2] <= rect.m_max[2] )
    {  
      // RemoveRect() returns 0 on success
      rc = (0 ==  RemoveRect(&rect, a_dataId, &m_root));
    }
    else
    {
      // invalid bounding box - don't let this corrupt the tree
      ON_ERROR("ON_RTree::Remove - invalid a_min[] or a_max[] input.");
    }
  }
  return rc;
}